

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

overlap_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
operator++(overlap_iterator *this)

{
  uint uVar1;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *pIVar2;
  pointer pEVar3;
  size_type sVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  
  pIVar2 = (this->super_iterator).super_const_iterator.map;
  pEVar3 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar5 = pEVar3[sVar4 - 1].offset + 1;
  uVar1 = pEVar3[sVar4 - 1].size;
  if (pIVar2->height == 0) {
    if (uVar5 < uVar1) {
      uVar6 = (ulong)uVar5;
      puVar7 = (ulong *)((long)pEVar3[sVar4 - 1].node + uVar6 * 0x10 + 8);
      do {
        if ((this->searchKey).right < puVar7[-1]) break;
        if ((this->searchKey).left <= *puVar7) goto LAB_002e623c;
        uVar6 = uVar6 + 1;
        puVar7 = puVar7 + 2;
      } while (uVar1 != uVar6);
    }
  }
  else if (uVar5 < uVar1) {
    uVar6 = (ulong)uVar5;
    puVar7 = (ulong *)((long)pEVar3[sVar4 - 1].node + uVar6 * 0x10 + 8);
    do {
      if ((this->searchKey).right < puVar7[-1]) break;
      if ((this->searchKey).left <= *puVar7) goto LAB_002e623c;
      uVar6 = uVar6 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar1 != uVar6);
  }
  pEVar3[sVar4 - 1].offset = uVar1;
LAB_002e6226:
  if (pIVar2->height != 0) {
    nextOverlap(this);
  }
  return this;
LAB_002e623c:
  pEVar3[sVar4 - 1].offset = (uint)uVar6;
  if (uVar1 != (uint)uVar6) {
    return this;
  }
  goto LAB_002e6226;
}

Assistant:

overlap_iterator& operator++() {
        SLANG_ASSERT(valid());

        uint32_t offset = this->path.leafOffset() + 1;
        auto size = this->path.leafSize();
        offset = this->isFlat()
                     ? this->path.template leaf<RootLeaf>().findFirstOverlap(offset, size,
                                                                             searchKey)
                     : this->path.template leaf<Leaf>().findFirstOverlap(offset, size, searchKey);

        this->path.leafOffset() = offset;
        if (offset == this->path.leafSize() && !this->isFlat())
            nextOverlap();

        return *this;
    }